

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,char *value)

{
  size_t in_RCX;
  void *in_RDX;
  cstring_spec_handler local_18;
  
  if (this->specs_ == (format_specs *)0x0) {
    write(this,(int)value,in_RDX,in_RCX);
  }
  else {
    local_18.formatter = this;
    local_18.value = value;
    handle_cstring_type_spec<char,fmt::v7::detail::arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>::cstring_spec_handler>
              (this->specs_->type,&local_18);
  }
  return (iterator)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(const Char* value) {
    if (!specs_) return write(value), out_;
    handle_cstring_type_spec(specs_->type, cstring_spec_handler(*this, value));
    return out_;
  }